

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phong.cpp
# Opt level: O3

RGBColor __thiscall pm::Phong::areaLightShade(Phong *this,ShadeRecord *sr)

{
  undefined4 uVar1;
  undefined8 uVar2;
  World *pWVar3;
  undefined4 uVar4;
  long *plVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  char cVar8;
  ulong uVar9;
  long in_RDX;
  long lVar10;
  ulong uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  RGBColor RVar22;
  Vector3 wi;
  RGBColor *L;
  float fStack_144;
  float local_128;
  float fStack_124;
  float local_120;
  undefined1 local_118 [16];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined8 local_f0;
  float local_e8;
  float local_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  Phong *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  float local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  undefined1 local_48 [16];
  
  local_b8 = ZEXT416(*(uint *)(in_RDX + 0x40));
  local_c8 = ZEXT416(*(uint *)(in_RDX + 0x44));
  local_d8 = ZEXT416(*(uint *)(in_RDX + 0x48));
  _local_108 = ZEXT416((uint)(sr->ray).o.y);
  uVar2 = *(undefined8 *)&(sr->normal).z;
  fVar12 = (float)uVar2;
  local_118 = ZEXT416((uint)((sr->ray).o.z * fVar12));
  local_a0 = this;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_f0);
  local_118._0_4_ = (float)local_118._0_4_ * local_e8;
  fStack_144 = (float)((ulong)uVar2 >> 0x20);
  local_108._4_4_ = (float)local_108._0_4_ * fVar12 * (float)((ulong)local_f0 >> 0x20);
  local_108._0_4_ = fVar12 * fStack_144 * (float)local_f0;
  _fStack_100 = 0;
  lVar10 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  if (lVar10 != 0) {
    local_68 = -(float)local_b8._0_4_;
    uStack_64 = local_b8._4_4_ ^ 0x80000000;
    uStack_60 = local_b8._8_4_ ^ 0x80000000;
    uStack_5c = local_b8._12_4_ ^ 0x80000000;
    local_78 = -(float)local_c8._0_4_;
    uStack_74 = local_c8._4_4_ ^ 0x80000000;
    uStack_70 = local_c8._8_4_ ^ 0x80000000;
    uStack_6c = local_c8._12_4_ ^ 0x80000000;
    local_58 = -(float)local_d8._0_4_;
    uStack_54 = local_d8._4_4_ ^ 0x80000000;
    uStack_50 = local_d8._8_4_ ^ 0x80000000;
    uStack_4c = local_d8._12_4_ ^ 0x80000000;
    uVar9 = 0;
    uVar11 = 1;
    do {
      plVar5 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar9 * 8);
      (**(code **)(*plVar5 + 0x10))(&local_128,plVar5);
      fVar12 = *(float *)(in_RDX + 0x28);
      fStack_144 = *(float *)(in_RDX + 0x2c);
      fVar15 = *(float *)(in_RDX + 0x30);
      fVar20 = fVar15 * local_120 + fVar12 * local_128 + fStack_144 * fStack_124;
      if (0.0 < fVar20) {
        local_48 = ZEXT416((uint)fVar20);
        if (*(char *)((long)plVar5 + 0xc) == '\x01') {
          local_f0 = *(undefined8 *)(in_RDX + 0x10);
          local_e8 = *(float *)(in_RDX + 0x18);
          local_dc = local_120;
          cVar8 = (**(code **)(*plVar5 + 0x20))(plVar5,&local_f0);
          if (cVar8 != '\0') goto LAB_0010e3fc;
          fVar12 = *(float *)(in_RDX + 0x28);
          fStack_144 = *(float *)(in_RDX + 0x2c);
          fVar15 = *(float *)(in_RDX + 0x30);
        }
        pWVar3 = sr->world;
        fVar21 = SUB84(pWVar3,0);
        fVar20 = *(float *)&sr->tracer;
        fVar19 = fVar15 * local_58 + fVar12 * local_68 + fStack_144 * local_78;
        fVar18 = *(float *)((long)&sr->tracer + 4);
        fVar12 = ((fVar15 + fVar15) * fVar19 + (float)local_d8._0_4_) * local_120 +
                 ((fStack_144 + fStack_144) * fVar19 + (float)local_c8._0_4_) * fStack_124 +
                 ((fVar12 + fVar12) * fVar19 + (float)local_b8._0_4_) * local_128;
        fVar19 = 0.0;
        fVar13 = 0.0;
        fVar14 = 0.0;
        fVar15 = 0.0;
        fVar16 = 0.0;
        if (0.0 < fVar12) {
          uVar1 = sr[1].localHitPoint.y;
          uVar4 = sr[1].localHitPoint.z;
          local_88 = CONCAT44(sr[1].normal.x * (float)uVar1,(float)uVar1 * (float)uVar4);
          uStack_80 = 0;
          local_98 = CONCAT44(uVar4,(float)uVar1 * sr[1].normal.y);
          uStack_90 = 0;
          fVar15 = powf(fVar12,sr[1].normal.z);
          fVar16 = (float)local_98 * fVar15;
          fVar19 = fVar15 * (float)local_88;
          fVar13 = fVar15 * local_88._4_4_;
          fVar14 = fVar15 * (float)uStack_80;
          fVar15 = fVar15 * uStack_80._4_4_;
        }
        (**(code **)(*plVar5 + 0x18))(&local_f0,plVar5);
        fVar12 = (fVar21 * fVar18 * 0.31830987 + fVar16) * local_e8;
        fVar18 = (float)local_f0;
        uVar9 = (ulong)local_f0 >> 0x20;
        fVar16 = (float)(**(code **)(*plVar5 + 0x28))(plVar5);
        fVar18 = (float)local_48._0_4_ *
                 fVar16 * fVar18 * (fVar21 * (float)((ulong)pWVar3 >> 0x20) * 0.31830987 + fVar19);
        fVar20 = (float)local_48._0_4_ *
                 fVar16 * (float)uVar9 * (fVar20 * fVar21 * 0.31830987 + fVar13);
        fVar19 = (float)local_48._0_4_ * fVar16 * (fVar14 + 0.0) * 0.0;
        fVar15 = (float)local_48._0_4_ * fVar16 * (fVar15 + 0.0) * 0.0;
        fStack_144 = fVar12 * fVar16 * (float)local_48._0_4_;
        fVar12 = (float)(**(code **)(*plVar5 + 0x30))(plVar5);
        fStack_144 = fStack_144 / fVar12;
        auVar7._4_4_ = fVar20;
        auVar7._0_4_ = fVar18;
        auVar7._8_4_ = fVar19;
        auVar7._12_4_ = fVar15;
        auVar17._4_4_ = fVar12;
        auVar17._0_4_ = fVar12;
        auVar17._8_4_ = fVar12;
        auVar17._12_4_ = fVar12;
        auVar17 = divps(auVar7,auVar17);
        local_108._4_4_ = (float)local_108._4_4_ + auVar17._4_4_;
        local_108._0_4_ = (float)local_108._0_4_ + auVar17._0_4_;
        fStack_100 = fStack_100 + auVar17._8_4_;
        fStack_fc = fStack_fc + auVar17._12_4_;
        local_118._0_4_ = (float)local_118._0_4_ + fStack_144;
      }
LAB_0010e3fc:
      bVar6 = uVar11 < (ulong)(lVar10 >> 3);
      uVar9 = uVar11;
      uVar11 = (ulong)((int)uVar11 + 1);
    } while (bVar6);
  }
  (local_a0->super_Material)._vptr_Material = (_func_int **)local_108;
  (local_a0->super_Material).type_ = (Type)local_118._0_8_;
  RVar22.b = fStack_144;
  RVar22.r = (float)local_118._0_4_;
  RVar22.g = (float)local_118._4_4_;
  return RVar22;
}

Assistant:

RGBColor Phong::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += (diffuseBrdf_.f(sr, wo, wi) + specularBrdf_.f(sr, wo, wi)) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}